

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

compute_mul_parity_result
fmt::v11::detail::dragonbox::cache_accessor<float>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  uint64_t uVar1;
  int in_EDX;
  uint64_t *in_RSI;
  uint32_t in_EDI;
  uint64_t r;
  bool local_16;
  bool local_15;
  int local_14;
  uint64_t *local_10;
  uint32_t local_8;
  compute_mul_parity_result local_2;
  
  local_15 = 0 < in_EDX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ignore_unused<bool,char[1]>(&local_15,(char (*) [1])0x81eebc);
  local_16 = local_14 < 0x40;
  ignore_unused<bool,char[1]>(&local_16,(char (*) [1])0x81eebc);
  uVar1 = umul96_lower64(local_8,*local_10);
  local_2.is_integer = (int)(uVar1 >> (0x20U - (char)local_14 & 0x3f)) == 0;
  local_2.parity = (uVar1 >> (0x40U - (char)local_14 & 0x3f) & 1) != 0;
  return local_2;
}

Assistant:

static auto compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta) noexcept
      -> compute_mul_parity_result {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul96_lower64(two_f, cache);
    return {((r >> (64 - beta)) & 1) != 0,
            static_cast<uint32_t>(r >> (32 - beta)) == 0};
  }